

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

void Curl_client_reset(Curl_easy *data)

{
  curl_trc_feat *pcVar1;
  uint uVar2;
  
  uVar2 = (uint)*(undefined8 *)&(data->set).field_0x89c;
  if (((data->req).field_0xd1 & 0x80) == 0) {
    if ((((uVar2 >> 0x1e & 1) != 0) &&
        ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))))
       && (0 < Curl_trc_feat_read.log_level)) {
      Curl_trc_read(data,"client_reset, clear readers");
    }
    cl_reset_reader(data);
  }
  else if (((uVar2 >> 0x1e & 1) != 0) &&
          (((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))
           && (0 < Curl_trc_feat_read.log_level)))) {
    Curl_trc_read(data,"client_reset, will rewind reader");
  }
  cl_reset_writer(data);
  (data->req).bytecount = 0;
  (data->req).headerline = 0;
  return;
}

Assistant:

void Curl_client_reset(struct Curl_easy *data)
{
  if(data->req.rewind_read) {
    /* already requested */
    CURL_TRC_READ(data, "client_reset, will rewind reader");
  }
  else {
    CURL_TRC_READ(data, "client_reset, clear readers");
    cl_reset_reader(data);
  }
  cl_reset_writer(data);

  data->req.bytecount = 0;
  data->req.headerline = 0;
}